

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schemeobject.cpp
# Opt level: O2

shared_ptr<ASTNode> __thiscall SchemeObject::to_AST(SchemeObject *this)

{
  eval_error *this_00;
  long *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  this_00 = (eval_error *)__cxa_allocate_exception(0x10);
  (**(code **)(*in_RSI + 0x10))(&bStack_58);
  std::operator+(&local_38,"Cannot evaluate ",&bStack_58);
  eval_error::runtime_error(this_00,&local_38);
  __cxa_throw(this_00,&eval_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::shared_ptr<ASTNode> SchemeObject::to_AST() const
{
    throw eval_error("Cannot evaluate " + external_repr());
}